

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O0

sshcom_key * load_sshcom_key(BinarySource *src,char **errmsg_p)

{
  char *b;
  int iVar1;
  sshcom_key *__dest;
  strbuf *psVar2;
  ushort **ppuVar3;
  byte *pbVar4;
  size_t sVar5;
  bool bVar6;
  uchar local_67 [3];
  int local_64;
  uchar out [3];
  char *pcStack_60;
  int line2len;
  char *line2;
  byte local_4d;
  int base64_chars;
  char base64_bit [4];
  byte *pbStack_48;
  _Bool headers_done;
  char *p;
  char *errmsg;
  int len;
  int hdrstart;
  char *line;
  sshcom_key *ret;
  char **errmsg_p_local;
  BinarySource *src_local;
  
  line2._4_4_ = 0;
  __dest = (sshcom_key *)safemalloc(1,0x108,0);
  __dest->comment[0] = '\0';
  psVar2 = strbuf_new_nm();
  __dest->keyblob = psVar2;
  _len = (byte *)bsgetline(src);
  if (_len == (byte *)0x0) {
    p = "unexpected end of file";
  }
  else {
    iVar1 = strcmp((char *)_len,"---- BEGIN SSH2 ENCRYPTED PRIVATE KEY ----");
    if (iVar1 == 0) {
      sVar5 = strlen((char *)_len);
      smemclr(_len,sVar5);
      safefree(_len);
      base64_chars._3_1_ = 0;
      while (_len = (byte *)bsgetline(src), _len != (byte *)0x0) {
        iVar1 = strcmp((char *)_len,"---- END SSH2 ENCRYPTED PRIVATE KEY ----");
        if (iVar1 == 0) {
          safefree(_len);
          _len = (byte *)0x0;
          if (__dest->keyblob->len != 0) {
            if (errmsg_p == (char **)0x0) {
              return __dest;
            }
            *errmsg_p = (char *)0x0;
            return __dest;
          }
          p = "key body not present";
          goto LAB_0011c226;
        }
        pbStack_48 = (byte *)strchr((char *)_len,0x3a);
        if (pbStack_48 == (byte *)0x0) {
          base64_chars._3_1_ = 1;
          pbStack_48 = _len;
          while( true ) {
            if (((((char)*pbStack_48 < 'A') || (bVar6 = true, 'Z' < (char)*pbStack_48)) &&
                (((char)*pbStack_48 < 'a' || (bVar6 = true, 'z' < (char)*pbStack_48)))) &&
               (((((char)*pbStack_48 < '0' || (bVar6 = true, '9' < (char)*pbStack_48)) &&
                 (bVar6 = true, *pbStack_48 != 0x2b)) && (bVar6 = true, *pbStack_48 != 0x2f)))) {
              bVar6 = *pbStack_48 == 0x3d;
            }
            if (!bVar6) break;
            iVar1 = line2._4_4_ + 1;
            (&local_4d)[line2._4_4_] = *pbStack_48;
            line2._4_4_ = iVar1;
            if (iVar1 == 4) {
              line2._4_4_ = 0;
              iVar1 = base64_decode_atom((char *)&local_4d,local_67);
              if (iVar1 < 1) {
                p = "invalid base64 encoding";
                goto LAB_0011c226;
              }
              BinarySink_put_data(__dest->keyblob->binarysink_,local_67,(long)iVar1);
            }
            pbStack_48 = pbStack_48 + 1;
          }
        }
        else {
          if ((base64_chars._3_1_ & 1) != 0) {
            p = "header found in body of key data";
            goto LAB_0011c226;
          }
          *pbStack_48 = 0;
          do {
            pbStack_48 = pbStack_48 + 1;
            bVar6 = false;
            if (*pbStack_48 != 0) {
              ppuVar3 = __ctype_b_loc();
              bVar6 = ((*ppuVar3)[(int)(uint)*pbStack_48] & 0x2000) != 0;
            }
          } while (bVar6);
          iVar1 = (int)pbStack_48 - (int)_len;
          sVar5 = strlen((char *)(_len + iVar1));
          errmsg._0_4_ = iVar1 + (int)sVar5;
          if (_len[(int)errmsg] != 0) {
            __assert_fail("!line[len]",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c"
                          ,0x6fd,"struct sshcom_key *load_sshcom_key(BinarySource *, const char **)"
                         );
          }
          while (_len[(int)errmsg + -1] == 0x5c) {
            pcStack_60 = bsgetline(src);
            if (pcStack_60 == (char *)0x0) {
              p = "unexpected end of file";
              pcStack_60 = (char *)0x0;
              goto LAB_0011c226;
            }
            sVar5 = strlen(pcStack_60);
            local_64 = (int)sVar5;
            _len = (byte *)saferealloc(_len,(long)((int)errmsg + local_64 + 1),1);
            strcpy((char *)(_len + (long)(int)errmsg + -1),pcStack_60);
            b = pcStack_60;
            errmsg._0_4_ = local_64 + -1 + (int)errmsg;
            if (_len[(int)errmsg] != 0) {
              __assert_fail("!line[len]",
                            "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c"
                            ,0x70c,
                            "struct sshcom_key *load_sshcom_key(BinarySource *, const char **)");
            }
            sVar5 = strlen(pcStack_60);
            smemclr(b,sVar5);
            safefree(pcStack_60);
            pcStack_60 = (char *)0x0;
          }
          pbStack_48 = _len + iVar1;
          iVar1 = strcmp((char *)_len,"Comment");
          pbVar4 = pbStack_48;
          if (iVar1 == 0) {
            if ((*pbStack_48 == 0x22) &&
               (sVar5 = strlen((char *)pbStack_48), pbVar4[sVar5 - 1] == 0x22)) {
              pbVar4 = pbStack_48 + 1;
              pbStack_48 = pbVar4;
              sVar5 = strlen((char *)pbVar4);
              pbVar4[sVar5 - 1] = 0;
            }
            strncpy((char *)__dest,(char *)pbStack_48,0x100);
            __dest->comment[0xff] = '\0';
          }
        }
        sVar5 = strlen((char *)_len);
        smemclr(_len,sVar5);
        safefree(_len);
      }
      p = "unexpected end of file";
    }
    else {
      p = "file does not begin with ssh.com key header";
    }
  }
LAB_0011c226:
  if (_len != (byte *)0x0) {
    sVar5 = strlen((char *)_len);
    smemclr(_len,sVar5);
    safefree(_len);
  }
  if (__dest != (sshcom_key *)0x0) {
    strbuf_free(__dest->keyblob);
    smemclr(__dest,0x108);
    safefree(__dest);
  }
  if (errmsg_p != (char **)0x0) {
    *errmsg_p = p;
  }
  return (sshcom_key *)0x0;
}

Assistant:

static struct sshcom_key *load_sshcom_key(BinarySource *src,
                                          const char **errmsg_p)
{
    struct sshcom_key *ret;
    char *line = NULL;
    int hdrstart, len;
    const char *errmsg;
    char *p;
    bool headers_done;
    char base64_bit[4];
    int base64_chars = 0;

    ret = snew(struct sshcom_key);
    ret->comment[0] = '\0';
    ret->keyblob = strbuf_new_nm();

    if (!(line = bsgetline(src))) {
        errmsg = "unexpected end of file";
        goto error;
    }
    if (0 != strcmp(line, "---- BEGIN SSH2 ENCRYPTED PRIVATE KEY ----")) {
        errmsg = "file does not begin with ssh.com key header";
        goto error;
    }
    smemclr(line, strlen(line));
    sfree(line);
    line = NULL;

    headers_done = false;
    while (1) {
        if (!(line = bsgetline(src))) {
            errmsg = "unexpected end of file";
            goto error;
        }
        if (!strcmp(line, "---- END SSH2 ENCRYPTED PRIVATE KEY ----")) {
            sfree(line);
            line = NULL;
            break;                     /* done */
        }
        if ((p = strchr(line, ':')) != NULL) {
            if (headers_done) {
                errmsg = "header found in body of key data";
                goto error;
            }
            *p++ = '\0';
            while (*p && isspace((unsigned char)*p)) p++;
            hdrstart = p - line;

            /*
             * Header lines can end in a trailing backslash for
             * continuation.
             */
            len = hdrstart + strlen(line+hdrstart);
            assert(!line[len]);
            while (line[len-1] == '\\') {
                char *line2;
                int line2len;

                line2 = bsgetline(src);
                if (!line2) {
                    errmsg = "unexpected end of file";
                    goto error;
                }

                line2len = strlen(line2);
                line = sresize(line, len + line2len + 1, char);
                strcpy(line + len - 1, line2);
                len += line2len - 1;
                assert(!line[len]);

                smemclr(line2, strlen(line2));
                sfree(line2);
                line2 = NULL;
            }
            p = line + hdrstart;
            if (!strcmp(line, "Comment")) {
                /* Strip quotes in comment if present. */
                if (p[0] == '"' && p[strlen(p)-1] == '"') {
                    p++;
                    p[strlen(p)-1] = '\0';
                }
                strncpy(ret->comment, p, sizeof(ret->comment));
                ret->comment[sizeof(ret->comment)-1] = '\0';
            }
        } else {
            headers_done = true;

            p = line;
            while (isbase64(*p)) {
                base64_bit[base64_chars++] = *p;
                if (base64_chars == 4) {
                    unsigned char out[3];

                    base64_chars = 0;

                    len = base64_decode_atom(base64_bit, out);

                    if (len <= 0) {
                        errmsg = "invalid base64 encoding";
                        goto error;
                    }

                    put_data(ret->keyblob, out, len);
                }

                p++;
            }
        }
        smemclr(line, strlen(line));
        sfree(line);
        line = NULL;
    }

    if (ret->keyblob->len == 0) {
        errmsg = "key body not present";
        goto error;
    }

    if (errmsg_p) *errmsg_p = NULL;
    return ret;

    error:
    if (line) {
        smemclr(line, strlen(line));
        sfree(line);
        line = NULL;
    }
    if (ret) {
        strbuf_free(ret->keyblob);
        smemclr(ret, sizeof(*ret));
        sfree(ret);
    }
    if (errmsg_p) *errmsg_p = errmsg;
    return NULL;
}